

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLock.cxx
# Opt level: O0

cmFileLockResult __thiscall
cmFileLock::Lock(cmFileLock *this,string *filename,unsigned_long timeout)

{
  bool bVar1;
  ulong uVar2;
  unsigned_long timeout_local;
  string *filename_local;
  cmFileLock *this_local;
  cmFileLockResult result;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      this_local = (cmFileLock *)cmFileLockResult::MakeInternal();
    }
    else {
      std::__cxx11::string::operator=((string *)&this->Filename,(string *)filename);
      this_local = (cmFileLock *)OpenFile(this);
      bVar1 = cmFileLockResult::IsOk((cmFileLockResult *)&this_local);
      if (bVar1) {
        if (timeout == 0xffffffffffffffff) {
          this_local = (cmFileLock *)LockWithoutTimeout(this);
        }
        else {
          this_local = (cmFileLock *)LockWithTimeout(this,timeout);
        }
      }
      bVar1 = cmFileLockResult::IsOk((cmFileLockResult *)&this_local);
      if (!bVar1) {
        std::__cxx11::string::operator=((string *)&this->Filename,"");
      }
    }
  }
  else {
    this_local = (cmFileLock *)cmFileLockResult::MakeInternal();
  }
  return (cmFileLockResult)this_local;
}

Assistant:

cmFileLockResult cmFileLock::Lock(const std::string& filename,
                                  unsigned long timeout)
{
  if (filename.empty()) {
    // Error is internal since all the directories and file must be created
    // before actual lock called.
    return cmFileLockResult::MakeInternal();
  }

  if (!this->Filename.empty()) {
    // Error is internal since double-lock must be checked in class
    // cmFileLockPool by the cmFileLock::IsLocked method.
    return cmFileLockResult::MakeInternal();
  }

  this->Filename = filename;
  cmFileLockResult result = this->OpenFile();
  if (result.IsOk()) {
    if (timeout == static_cast<unsigned long>(-1)) {
      result = this->LockWithoutTimeout();
    } else {
      result = this->LockWithTimeout(timeout);
    }
  }

  if (!result.IsOk()) {
    this->Filename = "";
  }

  return result;
}